

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config,string *objectFileName)

{
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  cmMakefile *pcVar3;
  __type _Var4;
  bool bVar5;
  string *psVar6;
  cmValue cVar7;
  iterator iVar8;
  cmFileSet *pcVar9;
  string *args_1;
  pointer pbVar10;
  pointer arch;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string flag;
  undefined1 local_380 [32];
  string *local_360;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  string filterArch;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  string pchOptions;
  cmGeneratorExpressionInterpreter genexInterpreter;
  
  pchSources._M_h._M_buckets = &pchSources._M_h._M_single_bucket;
  pchSources._M_h._M_bucket_count = 1;
  pchSources._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  pchSources._M_h._M_element_count = 0;
  pchSources._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pchSources._M_h._M_rehash_policy._M_next_resize = 0;
  pchSources._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::_Optional_payload_base<std::__cxx11::string>::
  _Optional_payload_base<std::__cxx11::string_const&>
            ((_Optional_payload_base<std::__cxx11::string> *)&local_220,language);
  cmGeneratorTarget::GetAppleArchs
            (&architectures,pcVar1,config,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_220);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_220);
  pbVar10 = architectures.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  arch = architectures.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      architectures.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&architectures);
    pbVar10 = architectures.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    arch = architectures.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  filterArch._M_dataplus._M_p = (pointer)&filterArch.field_2;
  filterArch._M_string_length = 0;
  filterArch.field_2._M_local_buf[0] = '\0';
  local_360 = objectFileName;
  for (; arch != pbVar10; arch = arch + 1) {
    cmGeneratorTarget::GetPchSource
              ((string *)&genexInterpreter,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               config,language,arch);
    psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &genexInterpreter,psVar6);
    if (_Var4) {
      std::__cxx11::string::_M_assign((string *)&filterArch);
    }
    if (genexInterpreter.GeneratorExpression.Backtrace.
        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pchOptions,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &genexInterpreter,arch);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pchSources,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pchOptions);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pchOptions);
    }
    std::__cxx11::string::~string((string *)&genexInterpreter);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cmGeneratorTarget::AddExplicitLanguageFlags
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,__return_storage_ptr__,source);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  cmCommonTargetGenerator::GetFlags
            (&pchOptions,&this->super_cmCommonTargetGenerator,language,config,&filterArch);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&pchOptions);
  bVar5 = std::operator==(language,"Fortran");
  if (bVar5) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
    cmCommonTargetGenerator::AppendFortranPreprocessFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source,NO);
  }
  pcVar2 = this->LocalGenerator;
  std::__cxx11::string::string((string *)&local_278,(string *)config);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_298,(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&genexInterpreter,(cmLocalGenerator *)pcVar2,&local_278,pcVar1,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&COMPILE_FLAGS,"COMPILE_FLAGS",(allocator<char> *)&pchOptions);
  cVar7 = cmSourceFile::GetProperty(source,&COMPILE_FLAGS);
  if (cVar7.Value != (string *)0x0) {
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_2b8,(string *)cVar7.Value);
    psVar6 = cmGeneratorExpressionInterpreter::Evaluate(&genexInterpreter,&local_2b8,&COMPILE_FLAGS)
    ;
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[7])(pcVar2,__return_storage_ptr__,psVar6);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&COMPILE_OPTIONS,"COMPILE_OPTIONS",(allocator<char> *)&pchOptions);
  cVar7 = cmSourceFile::GetProperty(source,&COMPILE_OPTIONS);
  if (cVar7.Value != (string *)0x0) {
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_2d8,(string *)cVar7.Value);
    psVar6 = cmGeneratorExpressionInterpreter::Evaluate
                       (&genexInterpreter,&local_2d8,&COMPILE_OPTIONS);
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar2,__return_storage_ptr__,psVar6,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  if (pchSources._M_h._M_element_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pchOptions,"SKIP_PRECOMPILE_HEADERS",(allocator<char> *)&flag);
    cVar7 = cmSourceFile::GetProperty(source,&pchOptions);
    std::__cxx11::string::~string((string *)&pchOptions);
    if (cVar7.Value == (string *)0x0) {
      pchOptions._M_dataplus._M_p = (pointer)&pchOptions.field_2;
      pchOptions._M_string_length = 0;
      pchOptions.field_2._M_local_buf[0] = '\0';
      psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      iVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&pchSources._M_h,psVar6);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_380._0_8_ = local_380 + 0x10;
        local_380._8_8_ = 0;
        local_380[0x10] = '\0';
        cmGeneratorTarget::GetPchUseCompileOptions
                  (&flag,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,language,
                   (string *)local_380);
        std::__cxx11::string::operator=((string *)&pchOptions,(string *)&flag);
        std::__cxx11::string::~string((string *)&flag);
        psVar6 = (string *)local_380;
      }
      else {
        cmGeneratorTarget::GetPchCreateCompileOptions
                  (&flag,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,language,
                   (string *)
                   ((long)iVar8.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
        psVar6 = &flag;
        std::__cxx11::string::operator=((string *)&pchOptions,(string *)psVar6);
      }
      std::__cxx11::string::~string((string *)psVar6);
      pcVar2 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_2f8,(string *)&pchOptions);
      psVar6 = cmGeneratorExpressionInterpreter::Evaluate
                         (&genexInterpreter,&local_2f8,&COMPILE_OPTIONS);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)pcVar2,__return_storage_ptr__,psVar6,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&pchOptions);
    }
  }
  pcVar9 = cmGeneratorTarget::GetFileSetForSource
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,source);
  if (pcVar9 != (cmFileSet *)0x0) {
    __x._M_str = (pcVar9->Type)._M_dataplus._M_p;
    __x._M_len = (pcVar9->Type)._M_string_length;
    __y._M_str = "CXX_MODULES";
    __y._M_len = 0xb;
    bVar5 = std::operator==(__x,__y);
    if (bVar5) {
      cmSourceFile::GetLanguage_abi_cxx11_(&pchOptions,source);
      __x_00._M_str = pchOptions._M_dataplus._M_p;
      __x_00._M_len = pchOptions._M_string_length;
      __y_00._M_str = "CXX";
      __y_00._M_len = 3;
      bVar5 = std::operator!=(__x_00,__y_00);
      std::__cxx11::string::~string((string *)&pchOptions);
      if (bVar5) {
        pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
        psVar6 = cmTarget::GetName_abi_cxx11_
                           (((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
        args_1 = cmSourceFile::GetFullPath_abi_cxx11_(source);
        cmStrCat<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[25],std::__cxx11::string_const&,char_const(&)[54]>
                  (&pchOptions,(char (*) [9])0x722418,psVar6,
                   (char (*) [25])"\" contains the source\n  ",args_1,
                   (char (*) [25])"\nin a file set of type \"",&pcVar9->Type,
                   (char (*) [54])"\" but the source is not classified as a \"CXX\" source.");
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&pchOptions);
        std::__cxx11::string::~string((string *)&pchOptions);
      }
      bVar5 = cmTarget::IsNormal(((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
      if (!bVar5) {
        pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pchOptions,"CMAKE_CXX_MODULE_BMI_ONLY_FLAG",
                   (allocator<char> *)local_380);
        psVar6 = cmMakefile::GetSafeDefinition(pcVar3,&pchOptions);
        std::__cxx11::string::string((string *)&flag,(string *)psVar6);
        std::__cxx11::string::~string((string *)&pchOptions);
        memset(&pchOptions,0,0x158);
        (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
          super_cmOutputConverter._vptr_cmOutputConverter[6])(local_380);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  ((cmRulePlaceholderExpander *)local_380._0_8_,
                   (cmOutputConverter *)this->LocalGenerator,&flag,(RuleVariables *)&pchOptions);
        cmLocalGenerator::AppendCompileOptions
                  ((cmLocalGenerator *)this->LocalGenerator,__return_storage_ptr__,&flag,(char *)0x0
                  );
        if ((cmRulePlaceholderExpander *)local_380._0_8_ != (cmRulePlaceholderExpander *)0x0) {
          (**(code **)(*(long *)local_380._0_8_ + 8))();
        }
        std::__cxx11::string::~string((string *)&flag);
      }
    }
  }
  std::__cxx11::string::~string((string *)&COMPILE_OPTIONS);
  std::__cxx11::string::~string((string *)&COMPILE_FLAGS);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&genexInterpreter);
  std::__cxx11::string::~string((string *)&filterArch);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&architectures);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&pchSources._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language,
  const std::string& config, const std::string& objectFileName)
{
  std::unordered_map<std::string, std::string> pchSources;
  std::vector<std::string> architectures =
    this->GeneratorTarget->GetAppleArchs(config, language);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::string filterArch;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);
    if (pchSource == source->GetFullPath()) {
      filterArch = arch;
    }
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  std::string flags;
  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  this->GeneratorTarget->AddExplicitLanguageFlags(flags, *source);

  if (!flags.empty()) {
    flags += " ";
  }
  flags += this->GetFlags(language, config, filterArch);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
    this->AppendFortranPreprocessFlags(flags, *source,
                                       PreprocessFlagsRequired::NO);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  // Add precompile headers compile options.
  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GeneratorTarget->GetPchCreateCompileOptions(
        config, language, pchIt->second);
    } else {
      pchOptions =
        this->GeneratorTarget->GetPchUseCompileOptions(config, language);
    }

    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(pchOptions, COMPILE_OPTIONS));
  }

  auto const* fs = this->GeneratorTarget->GetFileSetForSource(config, source);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    if (source->GetLanguage() != "CXX"_s) {
      this->GetMakefile()->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Target \"", this->GeneratorTarget->Target->GetName(),
                 "\" contains the source\n  ", source->GetFullPath(),
                 "\nin a file set of type \"", fs->GetType(),
                 R"(" but the source is not classified as a "CXX" source.)"));
    }

    if (!this->GeneratorTarget->Target->IsNormal()) {
      auto flag = this->GetMakefile()->GetSafeDefinition(
        "CMAKE_CXX_MODULE_BMI_ONLY_FLAG");
      cmRulePlaceholderExpander::RuleVariables compileObjectVars;
      compileObjectVars.Object = objectFileName.c_str();
      auto rulePlaceholderExpander =
        this->GetLocalGenerator()->CreateRulePlaceholderExpander();
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   flag, compileObjectVars);
      this->LocalGenerator->AppendCompileOptions(flags, flag);
    }
  }

  return flags;
}